

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O2

double __thiscall FIX::Dictionary::getDouble(Dictionary *this,string *key)

{
  double dVar1;
  string local_a8 [4];
  
  getString(local_a8,this,key,false);
  dVar1 = DoubleConvertor::convert(local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  return dVar1;
}

Assistant:

EXCEPT(ConfigError, FieldConvertError) {
  try {
    return DoubleConvertor::convert(getString(key));
  } catch (FieldConvertError &) {
    throw ConfigError("Illegal value " + getString(key) + " for " + key);
  }
}